

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrap.cpp
# Opt level: O2

client_socket * C_std::Network::easy_accept(client_socket *__return_storage_ptr__,int sockfd)

{
  in_port_t iVar1;
  int iVar2;
  char *pcVar3;
  allocator local_2051;
  string local_2050;
  socklen_t addr_len;
  sockaddr_in addr;
  char buf [8192];
  
  addr_len = 0x10;
  addr.sin_family = 0;
  addr.sin_port = 0;
  addr.sin_addr.s_addr = 0;
  addr.sin_zero[0] = '\0';
  addr.sin_zero[1] = '\0';
  addr.sin_zero[2] = '\0';
  addr.sin_zero[3] = '\0';
  addr.sin_zero[4] = '\0';
  addr.sin_zero[5] = '\0';
  addr.sin_zero[6] = '\0';
  addr.sin_zero[7] = '\0';
  iVar2 = Accept(sockfd,(sockaddr *)&addr,&addr_len);
  pcVar3 = inet_ntop(2,&addr.sin_addr,buf,0x2000);
  if (pcVar3 == (char *)0x0) {
    std::__cxx11::string::string((string *)&local_2050,"af to ip error",&local_2051);
    perror_exit(&local_2050);
    std::__cxx11::string::~string((string *)&local_2050);
  }
  iVar1 = addr.sin_port;
  std::__cxx11::string::string((string *)&local_2050,buf,&local_2051);
  __return_storage_ptr__->sockfd = iVar2;
  std::__cxx11::string::string((string *)&__return_storage_ptr__->ip,(string *)&local_2050);
  __return_storage_ptr__->port = (uint)(ushort)(iVar1 << 8 | iVar1 >> 8);
  std::__cxx11::string::~string((string *)&local_2050);
  return __return_storage_ptr__;
}

Assistant:

client_socket easy_accept(int sockfd) {
            struct sockaddr_in addr;
            socklen_t addr_len = sizeof(addr);
            memset(&addr, 0, sizeof(addr));
            int cfd = Accept(sockfd, reinterpret_cast<struct sockaddr *>(&addr), &addr_len);
            char buf[BUFSIZ];
            if (inet_ntop(AF_INET, &addr.sin_addr.s_addr, buf, BUFSIZ) == nullptr) {
                perror_exit("af to ip error");
            }
            return client_socket(cfd, ntohs(addr.sin_port), buf);
        }